

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O1

int __thiscall
qclab::io::QASMFile::
parse2const<qclab::qgates::SWAP<std::complex<float>>,qclab::QObject<std::complex<float>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
          *gate)

{
  QObject<std::complex<float>_> *pQVar1;
  int iVar2;
  int qubit1;
  string *psVar3;
  SWAP<std::complex<float>_> *this_00;
  bool bVar4;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::substr((ulong)&local_70,(ulong)command);
  std::operator+(&local_50,name,&this->qregName_);
  if (local_68 == local_50._M_string_length) {
    if (local_68 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_70,local_50._M_dataplus._M_p,local_68);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  iVar2 = 0;
  if (bVar4) {
    psVar3 = (string *)std::__cxx11::string::erase((ulong)command,0);
    iVar2 = parseQubit(this,psVar3);
    psVar3 = (string *)std::__cxx11::string::erase((ulong)command,0);
    qubit1 = parseQubit(this,psVar3);
    this_00 = (SWAP<std::complex<float>_> *)operator_new(0x10);
    qgates::SWAP<std::complex<float>_>::SWAP(this_00,iVar2,qubit1);
    pQVar1 = (gate->_M_t).
             super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
             .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl;
    (gate->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl =
         (QObject<std::complex<float>_> *)this_00;
    iVar2 = 1;
    if (pQVar1 != (QObject<std::complex<float>_> *)0x0) {
      (*pQVar1->_vptr_QObject[0xd])();
    }
  }
  return iVar2;
}

Assistant:

int parse2const( std::string name , std::string& command ,
                       std::unique_ptr< GATE >& gate ) const {
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + n2 ) == name + qregName_ ) {
          const auto qubit0 = parseQubit( command.erase( 0 , n1 + n2 + 1 ) ) ;
          const auto qubit1 = parseQubit( command.erase( 0 , n2 + 2 ) ) ;
          gate = std::make_unique< G >( qubit0 , qubit1 ) ;
          return 1 ;
        }
        return 0 ;
      }